

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O0

Var Js::JavascriptMath::Modulus_InPlace
              (Var aLeft,Var aRight,ScriptContext *scriptContext,JavascriptNumber *result)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  double value;
  double remainder;
  JavascriptNumber *result_local;
  ScriptContext *scriptContext_local;
  Var aRight_local;
  Var aLeft_local;
  
  if (aLeft == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/../Math/JavascriptMath.cpp"
                                ,0x432,"(aLeft != nullptr)","aLeft != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (aRight == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/../Math/JavascriptMath.cpp"
                                ,0x433,"(aRight != nullptr)","aRight != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/../Math/JavascriptMath.cpp"
                                ,0x434,"(scriptContext != nullptr)","scriptContext != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = TaggedInt::IsPair(aLeft,aRight);
  if (bVar2) {
    aLeft_local = TaggedInt::Modulus(aLeft,aRight,scriptContext);
  }
  else {
    value = Modulus_Helper(aLeft,aRight,scriptContext);
    aLeft_local = JavascriptNumber::InPlaceNew(value,scriptContext,result);
  }
  return aLeft_local;
}

Assistant:

Var JavascriptMath::Modulus_InPlace(Var aLeft, Var aRight, ScriptContext* scriptContext, JavascriptNumber* result)
        {
            JIT_HELPER_REENTRANT_HEADER(Op_ModulusInPlace);
            Assert(aLeft != nullptr);
            Assert(aRight != nullptr);
            Assert(scriptContext != nullptr);

            // If both arguments are TaggedInt, then try to do integer division
            // This case is not handled by the lowerer.
            if (TaggedInt::IsPair(aLeft, aRight))
            {
                return TaggedInt::Modulus(aLeft, aRight, scriptContext);
            }

            double remainder = Modulus_Helper(aLeft, aRight, scriptContext);
            return JavascriptNumber::InPlaceNew(remainder, scriptContext, result);
            JIT_HELPER_END(Op_ModulusInPlace);
        }